

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
detail::ComputeISPCObjectSuffixes_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,detail *this,cmGeneratorTarget *target)

{
  pointer pbVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  bool bVar3;
  string *psVar4;
  pointer pbVar5;
  string_view value;
  string_view arg;
  allocator<char> local_59;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> target_suffix;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&target_suffix,"ISPC_INSTRUCTION_SETS",&local_59);
  psVar4 = cmGeneratorTarget::GetSafeProperty((cmGeneratorTarget *)this,&target_suffix);
  std::__cxx11::string::~string((string *)&target_suffix);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  value._M_str = (psVar4->_M_dataplus)._M_p;
  value._M_len = psVar4->_M_string_length;
  local_58 = __return_storage_ptr__;
  bVar3 = cmValue::IsOff(value);
  pvVar2 = local_58;
  if (!bVar3) {
    arg._M_str = (psVar4->_M_dataplus)._M_p;
    arg._M_len = psVar4->_M_string_length;
    cmExpandList(arg,local_58,false);
    pbVar1 = (pvVar2->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar5 = (pvVar2->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1)
    {
      std::__cxx11::string::find((char)pbVar5,0x2d);
      std::__cxx11::string::substr((ulong)&target_suffix,(ulong)pbVar5);
      bVar3 = std::operator==(&target_suffix,"avx1");
      if (bVar3) {
        std::__cxx11::string::assign((char *)&target_suffix);
      }
      std::__cxx11::string::_M_assign((string *)pbVar5);
      std::__cxx11::string::~string((string *)&target_suffix);
    }
  }
  return local_58;
}

Assistant:

std::vector<std::string> ComputeISPCObjectSuffixes(cmGeneratorTarget* target)
{
  const std::string& targetProperty =
    target->GetSafeProperty("ISPC_INSTRUCTION_SETS");
  std::vector<std::string> ispcTargets;

  if (!cmIsOff(targetProperty)) {
    cmExpandList(targetProperty, ispcTargets);
    for (auto& ispcTarget : ispcTargets) {
      // transform targets into the suffixes
      auto pos = ispcTarget.find('-');
      auto target_suffix = ispcTarget.substr(0, pos);
      if (target_suffix ==
          "avx1") { // when targeting avx1 ISPC uses the 'avx' output string
        target_suffix = "avx";
      }
      ispcTarget = target_suffix;
    }
  }
  return ispcTargets;
}